

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

void __thiscall OpenMD::MoleculeStamp::validate(MoleculeStamp *this)

{
  pointer piVar1;
  pointer ppRVar2;
  long lVar3;
  pointer ppRVar4;
  long lVar5;
  int iVar6;
  pointer piVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  vector<int,_std::allocator<int>_> members;
  vector<int,_std::allocator<int>_> local_38;
  
  DataHolder::validate(&this->super_DataHolder);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->atom2Rigidbody,
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  piVar1 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar5 != 0) {
    iVar6 = -1;
    uVar9 = 0;
    do {
      piVar1[uVar9] = iVar6;
      uVar9 = uVar9 + 1;
      iVar6 = iVar6 + -1;
    } while ((uVar9 & 0xffffffff) < (ulong)(lVar5 >> 2));
  }
  ppRVar4 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->rigidBodyStamps_).
      super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppRVar4) {
    uVar9 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_38,&ppRVar4[(int)uVar9]->members_);
      if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        piVar1 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          piVar1[*piVar7] = (int)uVar9;
          piVar7 = piVar7 + 1;
        } while (piVar7 != local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar9 = uVar9 + 1;
      ppRVar4 = (this->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->rigidBodyStamps_).
                                   super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar4 >> 3))
    ;
  }
  checkAtoms(this);
  checkBonds(this);
  fillBondInfo(this);
  checkBends(this);
  checkTorsions(this);
  checkInversions(this);
  checkRigidBodies(this);
  checkCutoffGroups(this);
  checkFragments(this);
  checkConstraints(this);
  ppRVar4 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppRVar2 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)ppRVar2 - (long)ppRVar4 >> 3;
  if (ppRVar2 == ppRVar4) {
    iVar6 = 0;
  }
  else {
    lVar10 = lVar5 + (ulong)(lVar5 == 0);
    lVar11 = 0;
    lVar8 = 0;
    do {
      lVar3 = *(long *)((long)ppRVar4 + (lVar11 >> 0x1d));
      lVar8 = lVar8 + (*(long *)(lVar3 + 0x78) - *(long *)(lVar3 + 0x70) >> 2);
      iVar6 = (int)lVar8;
      lVar11 = lVar11 + 0x100000000;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  this->nintegrable_ =
       (int)((ulong)((long)(this->atomStamps_).
                           super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + ((int)lVar5 - iVar6);
  return;
}

Assistant:

void MoleculeStamp::validate() {
    DataHolder::validate();

    atom2Rigidbody.resize(getNAtoms());

    // A negative number means the atom is a free atom, and does not
    // belong to rigidbody. Every element in atom2Rigidbody has unique
    // negative number at the very beginning

    for (unsigned int i = 0; i < atom2Rigidbody.size(); ++i) {
      atom2Rigidbody[i] = -1 - int(i);
    }
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp  = getRigidBodyStamp(i);
      std::vector<int> members = rbStamp->getMembers();
      for (std::vector<int>::iterator j = members.begin(); j != members.end();
           ++j) {
        atom2Rigidbody[*j] = i;
      }
    }

    checkAtoms();
    checkBonds();
    fillBondInfo();
    checkBends();
    checkTorsions();
    checkInversions();
    checkRigidBodies();
    checkCutoffGroups();
    checkFragments();
    checkConstraints();

    size_t nrigidAtoms = 0;
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp = getRigidBodyStamp(i);
      nrigidAtoms += rbStamp->getNMembers();
    }
    nintegrable_ = getNAtoms() + getNRigidBodies() - nrigidAtoms;
  }